

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<std::pair<QString,_QString>_>::reallocateAndGrow
          (QArrayDataPointer<std::pair<QString,_QString>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<std::pair<QString,_QString>_> *old)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  pair<QString,_QString> *ppVar3;
  qsizetype qVar4;
  long lVar5;
  pair<QString,_QString> *ppVar6;
  pair<QString,_QString> *ppVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  QArrayDataPointer<std::pair<QString,_QString>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<std::pair<QString,_QString>_> *)0x0 && where == GrowsAtEnd) &&
       (pQVar1 = &this->d->super_QArrayData, pQVar1 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar8 = QArrayData::reallocateUnaligned
                       (pQVar1,this->ptr,0x30,
                        n + this->size +
                        ((long)((long)this->ptr -
                               ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
                        -0x5555555555555555,Grow);
    this->d = (Data *)auVar8._0_8_;
    this->ptr = (pair<QString,_QString> *)auVar8._8_8_;
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (pair<QString,_QString> *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    ppVar3 = local_48.ptr;
    if (this->size != 0) {
      lVar5 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) ||
          (old != (QArrayDataPointer<std::pair<QString,_QString>_> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        ppVar7 = this->ptr;
        ppVar6 = ppVar7 + lVar5;
        if ((lVar5 != 0) && (0 < lVar5)) {
          do {
            std::pair<QString,_QString>::pair(ppVar3 + local_48.size,ppVar7);
            ppVar7 = ppVar7 + 1;
            local_48.size = local_48.size + 1;
          } while (ppVar7 < ppVar6);
        }
      }
      else {
        QtPrivate::QGenericArrayOps<std::pair<QString,_QString>_>::moveAppend
                  ((QGenericArrayOps<std::pair<QString,_QString>_> *)&local_48,this->ptr,
                   this->ptr + lVar5);
      }
    }
    pDVar2 = this->d;
    ppVar3 = this->ptr;
    this->d = local_48.d;
    this->ptr = local_48.ptr;
    qVar4 = this->size;
    this->size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = ppVar3;
    local_48.size = qVar4;
    if (old != (QArrayDataPointer<std::pair<QString,_QString>_> *)0x0) {
      local_48.d = old->d;
      local_48.ptr = old->ptr;
      old->d = pDVar2;
      old->ptr = ppVar3;
      local_48.size = old->size;
      old->size = qVar4;
    }
    ~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }